

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionEntryPointInfo::OnCleanup(FunctionEntryPointInfo *this,bool isShutdown)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  FunctionProxy *pFVar5;
  FunctionInfo *this_00;
  undefined4 *puVar6;
  undefined4 extraout_var;
  FunctionEntryPointInfo *pFVar7;
  ScriptContext *scriptContext;
  nullptr_t local_28;
  FunctionBody *local_20;
  FunctionBody *functionBody;
  FunctionEntryPointInfo *pFStack_10;
  bool isShutdown_local;
  FunctionEntryPointInfo *this_local;
  
  functionBody._7_1_ = isShutdown;
  pFStack_10 = this;
  bVar2 = EntryPointInfo::IsCodeGenDone(&this->super_EntryPointInfo);
  if (bVar2) {
    pFVar5 = Memory::WriteBarrierPtr<Js::FunctionProxy>::operator->(&this->functionProxy);
    this_00 = FunctionProxy::GetFunctionInfo(pFVar5);
    BVar3 = FunctionInfo::HasBody(this_00);
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x23f1,"(this->functionProxy->GetFunctionInfo()->HasBody())",
                                  "this->functionProxy->GetFunctionInfo()->HasBody()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    EntryPointInfo::IsNativeEntryPointProcessed(&this->super_EntryPointInfo);
    pFVar5 = Memory::WriteBarrierPtr<Js::FunctionProxy>::operator->(&this->functionProxy);
    local_20 = FunctionProxy::GetFunctionBody(pFVar5);
    bVar2 = EntryPointInfo::GetIsTJMode(&this->super_EntryPointInfo);
    if (bVar2) {
      iVar4 = (*(this->super_EntryPointInfo).super_ProxyEntryPointInfo.super_ExpirableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0xb])();
      FunctionBody::ReleaseLoopHeaders((FunctionBody *)CONCAT44(extraout_var,iVar4));
    }
    pFVar7 = FunctionBody::GetSimpleJitEntryPointInfo(local_20);
    if (pFVar7 == this) {
      FunctionBody::SetSimpleJitEntryPointInfo(local_20,(FunctionEntryPointInfo *)0x0);
    }
    pFVar5 = Memory::WriteBarrierPtr<Js::FunctionProxy>::operator->(&this->functionProxy);
    scriptContext = FunctionProxy::GetScriptContext(pFVar5);
    EntryPointInfo::CleanupNativeCode(&this->super_EntryPointInfo,scriptContext);
  }
  local_28 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::FunctionProxy>::operator=(&this->functionProxy,&local_28);
  return;
}

Assistant:

void FunctionEntryPointInfo::OnCleanup(bool isShutdown)
    {
        if (this->IsCodeGenDone())
        {
            Assert(this->functionProxy->GetFunctionInfo()->HasBody());

#if ENABLE_NATIVE_CODEGEN
            if (this->IsNativeEntryPointProcessed())
            {
                JS_ETW(EtwTrace::LogMethodNativeUnloadEvent(this->functionProxy->GetFunctionBody(), this));
            }
#endif

            FunctionBody* functionBody = this->functionProxy->GetFunctionBody();
#ifdef ASMJS_PLAT
            if (this->GetIsTJMode())
            {
                // release LoopHeaders here if the entrypointInfo is TJ
                this->GetFunctionBody()->ReleaseLoopHeaders();
            }
#endif
            if(functionBody->GetSimpleJitEntryPointInfo() == this)
            {
                functionBody->SetSimpleJitEntryPointInfo(nullptr);
            }
#if ENABLE_NATIVE_CODEGEN
            CleanupNativeCode(this->functionProxy->GetScriptContext());
#endif
        }

        this->functionProxy = nullptr;
    }